

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgzip.c
# Opt level: O0

FT_Error ft_gzip_file_reset(FT_GZipFile zip)

{
  FT_Error FVar1;
  z_stream *zstream;
  FT_Error error;
  FT_Stream stream;
  FT_GZipFile zip_local;
  
  FVar1 = FT_Stream_Seek(zip->source,zip->start);
  if (FVar1 == 0) {
    inflateReset(&zip->zstream);
    (zip->zstream).avail_in = 0;
    (zip->zstream).next_in = zip->input;
    (zip->zstream).avail_out = 0;
    (zip->zstream).next_out = zip->buffer;
    zip->limit = (FT_Byte *)&zip->pos;
    zip->cursor = zip->limit;
    zip->pos = 0;
  }
  return FVar1;
}

Assistant:

static FT_Error
  ft_gzip_file_reset( FT_GZipFile  zip )
  {
    FT_Stream  stream = zip->source;
    FT_Error   error;


    if ( !FT_STREAM_SEEK( zip->start ) )
    {
      z_stream*  zstream = &zip->zstream;


      inflateReset( zstream );

      zstream->avail_in  = 0;
      zstream->next_in   = zip->input;
      zstream->avail_out = 0;
      zstream->next_out  = zip->buffer;

      zip->limit  = zip->buffer + FT_GZIP_BUFFER_SIZE;
      zip->cursor = zip->limit;
      zip->pos    = 0;
    }

    return error;
  }